

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O1

RotationY<float> * __thiscall
qclab::qgates::RotationY<float>::operator*=(RotationY<float> *this,RotationY<float> *rhs)

{
  float fVar1;
  float fVar2;
  angle_type aVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  iVar4 = (*(this->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])();
  iVar5 = (*(rhs->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])(rhs);
  if (iVar4 == iVar5) {
    aVar3 = (this->super_QRotationGate1<float>).rotation_.angle_;
    fVar6 = aVar3.cos_;
    fVar7 = aVar3.sin_;
    fVar1 = (rhs->super_QRotationGate1<float>).rotation_.angle_.cos_;
    fVar2 = (rhs->super_QRotationGate1<float>).rotation_.angle_.sin_;
    (this->super_QRotationGate1<float>).rotation_.angle_.cos_ = fVar6 * fVar1 - fVar2 * fVar7;
    (this->super_QRotationGate1<float>).rotation_.angle_.sin_ = fVar7 * fVar1 + fVar6 * fVar2;
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xa2,
                "RotationY<T> &qclab::qgates::RotationY<float>::operator*=(const RotationY<T> &) [T = float]"
               );
}

Assistant:

inline RotationY< T >& operator*=( const RotationY< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ *= rhs.rotation() ;
          return *this ;
        }